

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.h
# Opt level: O0

cmCMakePath * __thiscall cmCMakePath::Append(cmCMakePath *this,path *path)

{
  string local_38;
  path *local_18;
  path *path_local;
  cmCMakePath *this_local;
  
  local_18 = path;
  path_local = &this->Path;
  std::filesystem::__cxx11::path::operator/=(&this->Path,path);
  std::filesystem::__cxx11::path::generic_string(&local_38,&this->Path);
  std::filesystem::__cxx11::path::operator=(&this->Path,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return this;
}

Assistant:

cmCMakePath& Append(const cm::filesystem::path& path)
  {
    this->Path /= path;
    // filesystem::path::append use preferred_separator ('\' on Windows)
    // so convert back to '/'
    this->Path = this->Path.generic_string();
    return *this;
  }